

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O1

char * __thiscall asmjit::StringBuilder::prepare(StringBuilder *this,uint32_t op,size_t len)

{
  size_t __n;
  char *__src;
  size_t sVar1;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (op == 0) {
    if (len == 0) {
      if (this->_data != "") {
        *this->_data = '\0';
      }
      this->_length = 0;
    }
    else {
      if (this->_capacity < len) {
        if (0xffffffffffffffee < len) {
          return (char *)0x0;
        }
        uVar5 = len + 7 & 0xfffffffffffffff8;
        uVar4 = 0xf8;
        if (0xf8 < uVar5) {
          uVar4 = uVar5;
        }
        pcVar3 = (char *)malloc(uVar4 + 8);
        if (pcVar3 == (char *)0x0) {
          if (this->_data != "") {
            *this->_data = '\0';
          }
          this->_length = 0;
        }
        else {
          if (this->_canFree != 0) {
            free(this->_data);
          }
          this->_data = pcVar3;
          this->_capacity = uVar4 | 7;
          this->_canFree = 1;
        }
        if (pcVar3 == (char *)0x0) {
          return (char *)0x0;
        }
      }
      this->_data[len] = '\0';
      this->_length = len;
      if (this->_capacity < len) goto LAB_001674f2;
    }
    return this->_data;
  }
  if (len == 0) {
    return this->_data + this->_length;
  }
  __n = this->_length;
  if (-__n - 0x11 < len) {
    return (char *)0x0;
  }
  uVar5 = len + __n;
  uVar4 = this->_capacity;
  if (uVar4 < uVar5) {
    uVar2 = 0x100;
    if (0x100 < uVar4) {
      uVar2 = uVar4;
    }
    do {
      uVar4 = uVar2;
      if (0xfffff < uVar4) break;
      uVar2 = uVar4 * 2;
    } while (uVar4 < uVar5);
    if ((uVar4 < uVar5) && (uVar4 = uVar5, uVar5 < 0xffffffffffff7fff)) {
      uVar4 = uVar5 + 0x7fff & 0xffffffffffff8000;
    }
    pcVar3 = (char *)malloc((uVar4 + 7 & 0xfffffffffffffff8) + 8);
    if (pcVar3 == (char *)0x0) {
      return (char *)0x0;
    }
    __src = this->_data;
    memcpy(pcVar3,__src,__n);
    if (this->_canFree != 0) {
      free(__src);
    }
    this->_data = pcVar3;
    this->_capacity = uVar4 + 7 | 7;
    this->_canFree = 1;
  }
  pcVar3 = this->_data;
  sVar1 = this->_length;
  pcVar3[uVar5] = '\0';
  this->_length = uVar5;
  if (uVar5 <= this->_capacity) {
    return pcVar3 + sVar1;
  }
  prepare();
LAB_001674f2:
  prepare();
}

Assistant:

ASMJIT_FAVOR_SIZE char* StringBuilder::prepare(uint32_t op, size_t len) noexcept {
  if (op == kStringOpSet) {
    // We don't care here, but we can't return a null pointer since it indicates
    // failure in memory allocation.
    if (len == 0) {
      if (_data != StringBuilder_empty)
        _data[0] = 0;

      _length = 0;
      return _data;
    }

    if (_capacity < len) {
      if (len >= IntTraits<size_t>::maxValue() - sizeof(intptr_t) * 2)
        return nullptr;

      size_t to = Utils::alignTo<size_t>(len, sizeof(intptr_t));
      if (to < 256 - sizeof(intptr_t))
        to = 256 - sizeof(intptr_t);

      char* newData = static_cast<char*>(Internal::allocMemory(to + sizeof(intptr_t)));
      if (!newData) {
        clear();
        return nullptr;
      }

      if (_canFree)
        Internal::releaseMemory(_data);

      _data = newData;
      _capacity = to + sizeof(intptr_t) - 1;
      _canFree = true;
    }

    _data[len] = 0;
    _length = len;

    ASMJIT_ASSERT(_length <= _capacity);
    return _data;
  }
  else {
    // We don't care here, but we can't return a null pointer since it indicates
    // failure of memory allocation.
    if (len == 0)
      return _data + _length;

    // Overflow.
    if (IntTraits<size_t>::maxValue() - sizeof(intptr_t) * 2 - _length < len)
      return nullptr;

    size_t after = _length + len;
    if (_capacity < after) {
      size_t to = _capacity;

      if (to < 256)
        to = 256;

      while (to < 1024 * 1024 && to < after)
        to *= 2;

      if (to < after) {
        to = after;
        if (to < (IntTraits<size_t>::maxValue() - 1024 * 32))
          to = Utils::alignTo<size_t>(to, 1024 * 32);
      }

      to = Utils::alignTo<size_t>(to, sizeof(intptr_t));
      char* newData = static_cast<char*>(Internal::allocMemory(to + sizeof(intptr_t)));
      if (!newData) return nullptr;

      ::memcpy(newData, _data, _length);
      if (_canFree)
        Internal::releaseMemory(_data);

      _data = newData;
      _capacity = to + sizeof(intptr_t) - 1;
      _canFree = true;
    }

    char* ret = _data + _length;
    _data[after] = 0;
    _length = after;

    ASMJIT_ASSERT(_length <= _capacity);
    return ret;
  }
}